

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Mix_2in_6out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  
  for (lVar9 = 0; toMix != (uint32_t)lVar9; lVar9 = lVar9 + 1) {
    fVar1 = src[lVar9 * 2];
    fVar2 = src[lVar9 * 2 + 1];
    fVar3 = coefficients[7];
    fVar4 = coefficients[5];
    fVar5 = coefficients[2];
    fVar6 = coefficients[3];
    fVar7 = coefficients[6];
    fVar8 = coefficients[4];
    *dst = *dst + *coefficients * fVar1 + coefficients[1] * fVar2;
    dst[1] = dst[1] + fVar5 * fVar1 + fVar6 * fVar2;
    dst[2] = dst[2] + fVar8 * fVar1 + fVar4 * fVar2;
    dst[3] = dst[3] + fVar7 * fVar1 + fVar3 * fVar2;
    *(ulong *)(dst + 4) =
         CONCAT44((float)((ulong)*(undefined8 *)(dst + 4) >> 0x20) +
                  coefficients[10] * fVar1 + coefficients[0xb] * fVar2,
                  (float)*(undefined8 *)(dst + 4) +
                  coefficients[8] * fVar1 + coefficients[9] * fVar2);
    dst = dst + 6;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_6out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 6)
	{
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
		dst[1] += (
			(src[0] * coefficients[2]) +
			(src[1] * coefficients[3])
		);
		dst[2] += (
			(src[0] * coefficients[4]) +
			(src[1] * coefficients[5])
		);
		dst[3] += (
			(src[0] * coefficients[6]) +
			(src[1] * coefficients[7])
		);
		dst[4] += (
			(src[0] * coefficients[8]) +
			(src[1] * coefficients[9])
		);
		dst[5] += (
			(src[0] * coefficients[10]) +
			(src[1] * coefficients[11])
		);
	}
}